

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

void add_pax_attr_time(archive_string *as,char *key,int64_t sec,unsigned_long nanos)

{
  bool bVar1;
  char *pcVar2;
  char *value;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  char tmp [50];
  char local_18 [8];
  
  pcVar2 = local_18 + 1;
  local_18[1] = 0;
  uVar4 = 0xb;
  do {
    uVar3 = uVar4;
    uVar5 = nanos / 10;
    uVar6 = nanos % 10;
    uVar4 = uVar3 - 1;
    if (uVar3 == 2) break;
    nanos = uVar5;
  } while (uVar6 == 0);
  if (uVar3 != 2) {
    if (1 < (int)uVar4) {
      do {
        pcVar2[-1] = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar6 + 0x35]
        ;
        pcVar2 = pcVar2 + -1;
        uVar6 = uVar5 % 10;
        uVar4 = uVar4 - 1;
        uVar5 = uVar5 / 10;
      } while (1 < uVar4);
    }
    pcVar2[-1] = '.';
    pcVar2 = pcVar2 + -1;
  }
  uVar5 = -sec;
  if (0 < sec) {
    uVar5 = sec;
  }
  pcVar2 = pcVar2 + -1;
  do {
    value = pcVar2;
    *value = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar5 % 10 + 0x35];
    pcVar2 = value + -1;
    bVar1 = 9 < uVar5;
    uVar5 = uVar5 / 10;
  } while (bVar1);
  if (sec < 0) {
    *pcVar2 = '-';
    value = pcVar2;
  }
  add_pax_attr(as,key,value);
  return;
}

Assistant:

static void
add_pax_attr_time(struct archive_string *as, const char *key,
    int64_t sec, unsigned long nanos)
{
	int digit, i;
	char *t;
	/*
	 * Note that each byte contributes fewer than 3 base-10
	 * digits, so this will always be big enough.
	 */
	char tmp[1 + 3*sizeof(sec) + 1 + 3*sizeof(nanos)];

	tmp[sizeof(tmp) - 1] = 0;
	t = tmp + sizeof(tmp) - 1;

	/* Skip trailing zeros in the fractional part. */
	for (digit = 0, i = 10; i > 0 && digit == 0; i--) {
		digit = nanos % 10;
		nanos /= 10;
	}

	/* Only format the fraction if it's non-zero. */
	if (i > 0) {
		while (i > 0) {
			*--t = "0123456789"[digit];
			digit = nanos % 10;
			nanos /= 10;
			i--;
		}
		*--t = '.';
	}
	t = format_int(t, sec);

	add_pax_attr(as, key, t);
}